

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall
MemorySSADumper::dumpDDIMap(MemorySSADumper *this,DefinitionsMap<dg::dda::RWNode> *map)

{
  RWNode *node;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  
  p_Var1 = dg::Offset::UNKNOWN;
  plVar4 = (long *)&map->field_0x10;
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
    for (p_Var3 = (_Rb_tree_node_base *)plVar4[5]; p_Var3 != (_Rb_tree_node_base *)(plVar4 + 3);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      printf("<tr><td align=\"left\" colspan=\"4\">");
      Dumper::printName(&this->super_Dumper,(RWNode *)plVar4[1]);
      printf("</td></tr>");
      for (p_Var2 = p_Var3[2]._M_parent; p_Var2 != (_Base_ptr)&p_Var3[1]._M_right;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        node = *(RWNode **)(p_Var2 + 1);
        printf("<tr><td>&nbsp;&nbsp;</td><td>");
        if (*(_Base_ptr *)(p_Var3 + 1) == p_Var1) {
          printf("[? - ");
        }
        else {
          printf("[%lu - ");
        }
        if (p_Var3[1]._M_parent == p_Var1) {
          printf("?]");
        }
        else {
          printf("%lu]");
        }
        printf("</td><td>@</td><td>");
        Dumper::printName(&this->super_Dumper,node);
        puts("</td></tr>");
      }
    }
  }
  return;
}

Assistant:

void dumpDDIMap(const DefinitionsMap<RWNode> &map) {
        for (const auto &it : map) {
            for (const auto &it2 : it.second) {
                printf(R"(<tr><td align="left" colspan="4">)");
                printName(it.first);
                printf("</td></tr>");
                for (auto *where : it2.second) {
                    printf("<tr><td>&nbsp;&nbsp;</td><td>");
                    printInterval(it2.first);
                    printf("</td><td>@</td><td>");
                    printName(where);
                    puts("</td></tr>");
                }
            }
        }
    }